

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# verFormula.c
# Opt level: O2

void * Ver_FormulaParser(char *pFormula,void *pMan,Vec_Ptr_t *vNames,Vec_Ptr_t *vStackFn,
                        Vec_Int_t *vStackOp,char *pErrorMessage)

{
  byte bVar1;
  int iVar2;
  int Entry;
  size_t sVar3;
  void *pvVar4;
  Hop_Obj_t *pHVar5;
  char cVar6;
  char *pcVar7;
  size_t sStack_60;
  int local_4c;
  
  vNames->nSize = 0;
  vStackFn->nSize = 0;
  vStackOp->nSize = 0;
  cVar6 = *pFormula;
  if (((cVar6 == '0') && (pFormula[1] == '\0')) || (iVar2 = strcmp(pFormula,"1\'b0"), iVar2 == 0)) {
    return (void *)(*(ulong *)((long)pMan + 0x18) ^ 1);
  }
  if (((cVar6 == '1') && (pFormula[1] == '\0')) || (iVar2 = strcmp(pFormula,"1\'b1"), iVar2 == 0)) {
    return *(void **)((long)pMan + 0x18);
  }
  pcVar7 = pFormula + 1;
  iVar2 = 0;
  do {
    if (cVar6 == '(') {
      iVar2 = iVar2 + 1;
    }
    else if (cVar6 == ')') {
      iVar2 = iVar2 + -1;
    }
    else if (cVar6 == '\0') break;
    cVar6 = *pcVar7;
    pcVar7 = pcVar7 + 1;
  } while( true );
  if (iVar2 != 0) {
    pcVar7 = "Parse_FormulaParser(): Different number of opening and closing parentheses ().";
    sStack_60 = 0x4f;
LAB_002f9205:
    memcpy(pErrorMessage,pcVar7,sStack_60);
    return (void *)0x0;
  }
  sVar3 = strlen(pFormula);
  (pFormula + sVar3 + 1)[0] = ')';
  (pFormula + sVar3 + 1)[1] = '\0';
  for (; sVar3 != 0; sVar3 = sVar3 - 1) {
    pFormula[sVar3] = pFormula[sVar3 - 1];
  }
  *pFormula = '(';
  bVar1 = 0x28;
  local_4c = 1;
  do {
    switch(bVar1) {
    case 0x20:
      break;
    case 0x21:
switchD_002f9317_caseD_21:
      if (local_4c == 2) {
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Variable before negation.",0x31);
        return (void *)0x0;
      }
      Vec_IntPush(vStackOp,7);
      if (local_4c != 1) {
        if (local_4c == 4) {
          return (void *)0x0;
        }
        goto LAB_002f93e8;
      }
      break;
    case 0x22:
    case 0x23:
    case 0x24:
    case 0x25:
    case 0x27:
switchD_002f9317_caseD_22:
      iVar2 = Ver_FormulaParserFindVar(pFormula,vNames);
      cVar6 = *pFormula;
      pvVar4 = Vec_PtrEntry(vNames,iVar2 * 2);
      if (local_4c == 2) {
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Incorrect state.",0x28);
        return (void *)0x0;
      }
      pFormula = pFormula + (ulong)(cVar6 == '\\') + (long)((int)pvVar4 + -1);
      pHVar5 = Hop_IthVar((Hop_Man_t *)pMan,iVar2);
      Vec_PtrPush(vStackFn,pHVar5);
      goto LAB_002f945c;
    case 0x26:
switchD_002f9317_caseD_26:
      if (local_4c != 2) {
        pcVar7 = "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR.";
        sStack_60 = 0x45;
        goto LAB_002f9205;
      }
      iVar2 = 6;
      if (bVar1 == 0x26) {
LAB_002f93d9:
        Vec_IntPush(vStackOp,iVar2);
        local_4c = 3;
      }
      else {
        if (bVar1 == 0x3f) {
          iVar2 = 2;
          goto LAB_002f93d9;
        }
        if (bVar1 == 0x5e) {
          iVar2 = 5;
          goto LAB_002f93d9;
        }
        local_4c = 3;
        if (bVar1 == 0x7c) {
          iVar2 = 4;
          goto LAB_002f93d9;
        }
      }
LAB_002f93e8:
      while (iVar2 = Vec_IntPop(vStackOp), vStackOp->nSize != 0) {
        Entry = Vec_IntPop(vStackOp);
        if ((Entry < iVar2) || (Entry == 2 && iVar2 == 2)) {
          Vec_IntPush(vStackOp,Entry);
          break;
        }
        pHVar5 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,Entry);
        if (pHVar5 == (Hop_Obj_t *)0x0) {
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Unknown operation\n",0x2a);
          return (void *)0x0;
        }
        Vec_IntPush(vStackOp,iVar2);
      }
      Vec_IntPush(vStackOp,iVar2);
      break;
    case 0x28:
      if (local_4c == 2) {
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): Variable before a parenthesis.",0x36);
        return (void *)0x0;
      }
      Vec_IntPush(vStackOp,1);
      local_4c = 1;
      break;
    case 0x29:
      if (vStackOp->nSize == 0) {
LAB_002f94cc:
        builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): There is no opening parenthesis\n",
                        0x38);
        return (void *)0x0;
      }
      iVar2 = 1;
      while( true ) {
        if (iVar2 == 0) goto LAB_002f94cc;
        iVar2 = Vec_IntPop(vStackOp);
        if (iVar2 == 1) break;
        pHVar5 = Ver_FormulaParserTopOper((Hop_Man_t *)pMan,vStackFn,iVar2);
        if (pHVar5 == (Hop_Obj_t *)0x0) {
          builtin_strncpy(pErrorMessage + 0x10,"ser(): Unknown operation\n",0x1a);
          goto LAB_002f9524;
        }
        iVar2 = vStackOp->nSize;
      }
      if (local_4c == 4) {
        return (void *)0x0;
      }
LAB_002f945c:
      while (vStackOp->nSize != 0) {
        iVar2 = Vec_IntPop(vStackOp);
        if (iVar2 != 7) {
          Vec_IntPush(vStackOp,iVar2);
          break;
        }
        pvVar4 = Vec_PtrPop(vStackFn);
        Vec_PtrPush(vStackFn,(void *)((ulong)pvVar4 ^ 1));
      }
      local_4c = 2;
      break;
    default:
      if ((1 < bVar1 - 9) && (bVar1 != 0xd)) {
        if ((bVar1 == 0x3a) || (((bVar1 == 0x3f || (bVar1 == 0x5e)) || (bVar1 == 0x7c))))
        goto switchD_002f9317_caseD_26;
        if (bVar1 == 0x7e) goto switchD_002f9317_caseD_21;
        if (bVar1 != 0) goto switchD_002f9317_caseD_22;
        if (local_4c == 4) {
          return (void *)0x0;
        }
        if (vStackFn->nSize == 0) {
          builtin_strncpy(pErrorMessage,"Parse_FormulaParser(): The input string is empty\n",0x32);
          return (void *)0x0;
        }
        pvVar4 = Vec_PtrPop(vStackFn);
        if (vStackFn->nSize != 0) {
          builtin_strncpy(pErrorMessage + 0x10,"ser(): Something is left in the function stack\n",
                          0x30);
LAB_002f9524:
          builtin_strncpy(pErrorMessage,"Parse_FormulaPar",0x10);
          return (void *)0x0;
        }
        if (vStackOp->nSize == 0) {
          return pvVar4;
        }
        pcVar7 = "Parse_FormulaParser(): Something is left in the operation stack\n";
        sStack_60 = 0x41;
        goto LAB_002f9205;
      }
    }
    bVar1 = pFormula[1];
    pFormula = pFormula + 1;
  } while( true );
}

Assistant:

void * Ver_FormulaParser( char * pFormula, void * pMan, Vec_Ptr_t * vNames, Vec_Ptr_t * vStackFn, Vec_Int_t * vStackOp, char * pErrorMessage )
{
    char * pTemp;
    Hop_Obj_t * bFunc, * bTemp;
    int nParans, Flag;
    int Oper, Oper1, Oper2;
    int v;

    // clear the stacks and the names
    Vec_PtrClear( vNames );
    Vec_PtrClear( vStackFn );
    Vec_IntClear( vStackOp );

    if ( !strcmp(pFormula, "0") || !strcmp(pFormula, "1\'b0") )
        return Hop_ManConst0((Hop_Man_t *)pMan);
    if ( !strcmp(pFormula, "1") || !strcmp(pFormula, "1\'b1") )
        return Hop_ManConst1((Hop_Man_t *)pMan);

    // make sure that the number of opening and closing parentheses is the same
    nParans = 0;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
        if ( *pTemp == '(' )
            nParans++;
        else if ( *pTemp == ')' )
            nParans--;
    if ( nParans != 0 )
    {
        sprintf( pErrorMessage, "Parse_FormulaParser(): Different number of opening and closing parentheses ()." );
        return NULL;
    }
 
    // add parentheses
    pTemp = pFormula + strlen(pFormula) + 2;
    *pTemp-- = 0; *pTemp = ')';
    while ( --pTemp != pFormula )
        *pTemp = *(pTemp - 1);
    *pTemp = '(';

    // perform parsing
    Flag = VER_PARSE_FLAG_START;
    for ( pTemp = pFormula; *pTemp; pTemp++ )
    {
        switch ( *pTemp )
        {
        // skip all spaces, tabs, and end-of-lines
        case ' ':
        case '\t':
        case '\r':
        case '\n':
            continue;
/*
        // treat Constant 0 as a variable
        case VER_PARSE_SYM_CONST0:
            Vec_PtrPush( vStackFn, Hop_ManConst0(pMan) );  // Cudd_Ref( Hop_ManConst0(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 0." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;

        // the same for Constant 1
        case VER_PARSE_SYM_CONST1:
            Vec_PtrPush( vStackFn, Hop_ManConst1(pMan) );  //  Cudd_Ref( Hop_ManConst1(pMan) );
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): No operation symbol before constant 1." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Flag = VER_PARSE_FLAG_VAR; 
            break;
*/
        case VER_PARSE_SYM_NEGBEF1:
        case VER_PARSE_SYM_NEGBEF2:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {// if NEGBEF follows a variable, AND is assumed
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before negation." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_NEG );
            break;

        case VER_PARSE_SYM_AND:
        case VER_PARSE_SYM_OR:
        case VER_PARSE_SYM_XOR:
        case VER_PARSE_SYM_MUX1:
        case VER_PARSE_SYM_MUX2:
            if ( Flag != VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no variable before AND, EXOR, or OR." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( *pTemp == VER_PARSE_SYM_AND )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_AND );
            else if ( *pTemp == VER_PARSE_SYM_OR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_OR );
            else if ( *pTemp == VER_PARSE_SYM_XOR )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_XOR );
            else if ( *pTemp == VER_PARSE_SYM_MUX1 )
                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
//            else if ( *pTemp == VER_PARSE_SYM_MUX2 )
//                Vec_IntPush( vStackOp, VER_PARSE_OPER_MUX );
            Flag = VER_PARSE_FLAG_OPER; 
            break;

        case VER_PARSE_SYM_OPEN:
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Variable before a parenthesis." );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            Vec_IntPush( vStackOp, VER_PARSE_OPER_MARK );
            // after an opening bracket, it feels like starting over again
            Flag = VER_PARSE_FLAG_START; 
            break;

        case VER_PARSE_SYM_CLOSE:
            if ( Vec_IntSize( vStackOp ) )
            {
                while ( 1 )
                {
                    if ( !Vec_IntSize( vStackOp ) )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                        Flag = VER_PARSE_FLAG_ERROR; 
                        break;
                    }
                    Oper = Vec_IntPop( vStackOp );
                    if ( Oper == VER_PARSE_OPER_MARK )
                        break;
                    // skip the second MUX operation
//                    if ( Oper == VER_PARSE_OPER_MUX2 )
//                    {
//                        Oper = Vec_IntPop( vStackOp );
//                        assert( Oper == VER_PARSE_OPER_MUX1 );
//                    }

                    // perform the given operation
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                }
            }
            else
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): There is no opening parenthesis\n" );
                Flag = VER_PARSE_FLAG_ERROR; 
                break;
            }
            if ( Flag != VER_PARSE_FLAG_ERROR )
                Flag = VER_PARSE_FLAG_VAR; 
            break;


        default:
            // scan the next name
            v = Ver_FormulaParserFindVar( pTemp, vNames );
            if ( *pTemp == '\\' )
                pTemp++;
            pTemp += (int)(ABC_PTRUINT_T)Vec_PtrEntry( vNames, 2*v ) - 1;

            // assume operation AND, if vars follow one another
            if ( Flag == VER_PARSE_FLAG_VAR )
            {
                sprintf( pErrorMessage, "Parse_FormulaParser(): Incorrect state." );
                return NULL;
            }
            bTemp = Hop_IthVar( (Hop_Man_t *)pMan, v );
            Vec_PtrPush( vStackFn, bTemp ); //  Cudd_Ref( bTemp );
            Flag = VER_PARSE_FLAG_VAR; 
            break;
        }

        if ( Flag == VER_PARSE_FLAG_ERROR )
            break;      // error exit
        else if ( Flag == VER_PARSE_FLAG_START )
            continue;  //  go on parsing
        else if ( Flag == VER_PARSE_FLAG_VAR )
            while ( 1 )
            {  // check if there are negations in the OpStack     
                if ( !Vec_IntSize(vStackOp) )
                    break;
                Oper = Vec_IntPop( vStackOp );
                if ( Oper != VER_PARSE_OPER_NEG )
                {
                    Vec_IntPush( vStackOp, Oper );
                    break;
                }
                else
                {
//                      Vec_PtrPush( vStackFn, Cudd_Not(Vec_PtrPop(vStackFn)) );
                      Vec_PtrPush( vStackFn, Hop_Not((Hop_Obj_t *)Vec_PtrPop(vStackFn)) );
                }
            }
        else // if ( Flag == VER_PARSE_FLAG_OPER )
            while ( 1 )
            {  // execute all the operations in the OpStack
               // with precedence higher or equal than the last one
                Oper1 = Vec_IntPop( vStackOp ); // the last operation
                if ( !Vec_IntSize(vStackOp) ) 
                {  // if it is the only operation, push it back
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
                Oper2 = Vec_IntPop( vStackOp ); // the operation before the last one
                if ( Oper2 >= Oper1 && !(Oper1 == Oper2 && Oper1 == VER_PARSE_OPER_MUX) )  
                {  // if Oper2 precedence is higher or equal, execute it
                    if ( Ver_FormulaParserTopOper( (Hop_Man_t *)pMan, vStackFn, Oper2 ) == NULL )
                    {
                        sprintf( pErrorMessage, "Parse_FormulaParser(): Unknown operation\n" );
                        return NULL;
                    }
                    Vec_IntPush( vStackOp,  Oper1 );     // push the last operation back
                }
                else
                {  // if Oper2 precedence is lower, push them back and done
                    Vec_IntPush( vStackOp, Oper2 );
                    Vec_IntPush( vStackOp, Oper1 );
                    break;
                }
            }
    }

    if ( Flag != VER_PARSE_FLAG_ERROR )
    {
        if ( Vec_PtrSize(vStackFn) )
        {    
            bFunc = (Hop_Obj_t *)Vec_PtrPop(vStackFn);
            if ( !Vec_PtrSize(vStackFn) )
                if ( !Vec_IntSize(vStackOp) )
                {
//                    Cudd_Deref( bFunc );
                    return bFunc;
                }
                else
                    sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the operation stack\n" );
            else
                sprintf( pErrorMessage, "Parse_FormulaParser(): Something is left in the function stack\n" );
        }
        else
            sprintf( pErrorMessage, "Parse_FormulaParser(): The input string is empty\n" );
    }
//    Cudd_Ref( bFunc );
//    Cudd_RecursiveDeref( dd, bFunc );
    return NULL;
}